

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_hash(ptls_hash_algorithm_t *hash)

{
  int iVar1;
  ptls_hash_context_t *ppVar2;
  uint8_t digest [64];
  undefined1 auStack_58 [64];
  
  ppVar2 = (*hash->create)();
  if (ppVar2 != (ptls_hash_context_t *)0x0) {
    (*ppVar2->update)(ppVar2,"",0);
    (*ppVar2->final)(ppVar2,auStack_58,PTLS_HASH_FINAL_MODE_FREE);
  }
  _ok((uint)(ppVar2 != (ptls_hash_context_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x40);
  iVar1 = bcmp(auStack_58,hash->empty_digest,hash->digest_size);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x41);
  return;
}

Assistant:

static void test_hash(ptls_hash_algorithm_t *hash)
{
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret = ptls_calc_hash(hash, digest, "", 0);
    ok(ret == 0);
    ok(memcmp(digest, hash->empty_digest, hash->digest_size) == 0);
}